

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_layer.c
# Opt level: O1

REF_STATUS ref_layer_align_prism(REF_GRID ref_grid,REF_DICT ref_dict_bcs)

{
  int iVar1;
  REF_NODE pRVar2;
  REF_ADJ pRVar3;
  REF_ADJ_ITEM pRVar4;
  REF_DBL *pRVar5;
  REF_GEOM ref_geom;
  REF_INT *pRVar6;
  REF_CELL pRVar7;
  int *piVar8;
  REF_INT *pRVar9;
  uint uVar10;
  REF_STATUS RVar11;
  REF_BOOL RVar12;
  uint uVar13;
  void *pvVar14;
  long lVar15;
  long lVar16;
  REF_CELL pRVar17;
  long lVar18;
  undefined8 uVar19;
  REF_INT RVar20;
  int iVar21;
  int iVar22;
  REF_NODE pRVar23;
  char *pcVar24;
  ulong uVar25;
  long lVar26;
  long lVar27;
  REF_INT RVar28;
  ulong uVar29;
  REF_DICT pRVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  double dVar34;
  double dVar35;
  REF_INT new_node;
  REF_CAVITY ref_cavity;
  REF_BOOL has_side_1;
  REF_GLOB global;
  REF_INT nodes [27];
  REF_INT bc_1;
  REF_BOOL has_side;
  REF_DBL tri_normal [3];
  REF_INT bc;
  uint local_634;
  uint local_620;
  void *local_618;
  int local_608;
  bool local_601;
  REF_NODE local_600;
  REF_DICT local_5f8;
  void *local_5f0;
  REF_CAVITY local_5e8;
  double local_5e0;
  undefined8 local_5d8;
  double local_5c8;
  uint local_5c0;
  undefined4 uStack_5bc;
  int local_5b4;
  int local_5b0;
  int local_5ac;
  int local_5a8 [29];
  REF_INT local_534;
  ulong local_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 local_4b8;
  double local_4b0;
  double local_4a8;
  long local_440;
  undefined8 local_438;
  REF_INT local_430;
  uint uStack_42c;
  double local_428;
  double local_420;
  double local_418;
  double local_410;
  
  pRVar2 = ref_grid->node;
  pRVar17 = ref_grid->cell[3];
  uVar10 = ref_node_synchronize_globals(pRVar2);
  if (uVar10 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",0x472,
           "ref_layer_align_prism",(ulong)uVar10,"sync glob");
    return uVar10;
  }
  uVar10 = ref_export_by_extension(ref_grid,"ref_layer_prism_before.tec");
  if (uVar10 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",0x475,
           "ref_layer_align_prism",(ulong)uVar10);
    return uVar10;
  }
  local_5f8 = ref_dict_bcs;
  if ((long)pRVar2->max < 0) {
    local_634 = 1;
    pcVar24 = "malloc active of REF_BOOL negative";
LAB_001f8442:
    bVar33 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",0x477,
           "ref_layer_align_prism",pcVar24);
    pvVar14 = (void *)0x0;
  }
  else {
    pvVar14 = malloc((long)pRVar2->max << 2);
    if (pvVar14 == (void *)0x0) {
      local_634 = 2;
      pcVar24 = "malloc active of REF_BOOL NULL";
      goto LAB_001f8442;
    }
    bVar33 = true;
    local_634 = 0;
    if (0 < pRVar2->max) {
      lVar15 = 0;
      do {
        *(undefined4 *)((long)pvVar14 + lVar15 * 4) = 0;
        lVar15 = lVar15 + 1;
      } while (lVar15 < pRVar2->max);
    }
  }
  if (!bVar33) {
    return local_634;
  }
  if ((long)pRVar2->max < 0) {
    local_634 = 1;
    pcVar24 = "malloc off_node of REF_BOOL negative";
LAB_001f84d8:
    bVar33 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",0x478,
           "ref_layer_align_prism",pcVar24);
    local_618 = (void *)0x0;
  }
  else {
    local_618 = malloc((long)pRVar2->max << 2);
    if (local_618 == (void *)0x0) {
      local_634 = 2;
      pcVar24 = "malloc off_node of REF_BOOL NULL";
      goto LAB_001f84d8;
    }
    bVar33 = true;
    if (0 < pRVar2->max) {
      lVar15 = 0;
      do {
        *(undefined4 *)((long)local_618 + lVar15 * 4) = 0xffffffff;
        lVar15 = lVar15 + 1;
      } while (lVar15 < pRVar2->max);
    }
  }
  if (bVar33) {
    if (0 < pRVar17->max) {
      RVar28 = 0;
      do {
        RVar11 = ref_cell_nodes(pRVar17,RVar28,local_5a8);
        if (RVar11 == 0) {
          local_438._0_4_ = 0xffffffff;
          uVar10 = ref_dict_value(local_5f8,local_5a8[pRVar17->node_per],(REF_INT *)&local_438);
          if ((uVar10 != 0) && (uVar10 != 5)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                   ,0x47d,"ref_layer_align_prism",(ulong)uVar10);
            local_634 = uVar10;
          }
          if ((((uVar10 == 5) || (uVar10 == 0)) &&
              (RVar12 = ref_phys_wall_distance_bc((uint)local_438), RVar12 != 0)) &&
             (0 < pRVar17->node_per)) {
            lVar15 = 0;
            do {
              *(undefined4 *)((long)pvVar14 + (long)local_5a8[lVar15] * 4) = 1;
              lVar15 = lVar15 + 1;
            } while (lVar15 < pRVar17->node_per);
          }
          if ((uVar10 != 5) && (uVar10 != 0)) {
            return local_634;
          }
        }
        RVar28 = RVar28 + 1;
      } while (RVar28 < pRVar17->max);
    }
    pRVar2 = ref_grid->node;
    local_5f0 = pvVar14;
    if (0 < pRVar2->max) {
      pRVar23 = (REF_NODE)ref_grid->cell[3];
      lVar15 = 0;
      local_600 = pRVar23;
LAB_001f863b:
      if (((-1 < pRVar2->global[lVar15]) && (pRVar2->ref_mpi->id == pRVar2->part[lVar15])) &&
         (*(int *)((long)pvVar14 + lVar15 * 4) != 0)) {
        local_528 = 0.0;
        uStack_520 = 0.0;
        local_518 = 0.0;
        pRVar3 = *(REF_ADJ *)&pRVar23->naux;
        uVar25 = 0xffffffff;
        if (lVar15 < pRVar3->nnode) {
          uVar25 = (ulong)(uint)pRVar3->first[lVar15];
        }
        if ((int)uVar25 == -1) {
          bVar33 = true;
          local_5e0 = (double)CONCAT44(local_5e0._4_4_,0xffffffff);
        }
        else {
          iVar22 = pRVar3->item[(int)uVar25].ref;
          local_5e0 = (double)CONCAT44(local_5e0._4_4_,0xffffffff);
          bVar33 = false;
          do {
            RVar28 = *(REF_INT *)
                      ((long)pRVar23->real +
                      ((long)pRVar23->blank * (long)iVar22 + (long)*(int *)&pRVar23->field_0xc) * 4)
            ;
            uVar10 = ref_dict_value(local_5f8,RVar28,&local_534);
            if ((uVar10 != 0) && (uVar10 != 5)) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                     ,0x3f7,"ref_layer_prism_insert_hair",(ulong)uVar10);
              local_620 = uVar10;
            }
            if ((uVar10 != 5) && (uVar13 = local_620, uVar10 != 0)) goto LAB_001f8f91;
            RVar12 = ref_phys_wall_distance_bc(local_534);
            pRVar23 = local_600;
            if (RVar12 == 0) {
              bVar31 = local_5e0._0_4_ != -1;
              bVar32 = local_5e0._0_4_ != RVar28;
              bVar33 = true;
              local_5e0 = (double)CONCAT44(local_5e0._4_4_,RVar28);
              if (bVar32 && bVar31) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                       ,0x402,"ref_layer_prism_insert_hair","multiple face constraints");
                uVar13 = 1;
                goto LAB_001f8f91;
              }
            }
            else {
              uVar13 = ref_node_tri_normal(pRVar2,(REF_INT *)
                                                  ((long)local_600->blank * (long)iVar22 * 4 +
                                                  (long)local_600->real),(REF_DBL *)&local_4b8);
              if (uVar13 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                       ,0x3fb,"ref_layer_prism_insert_hair",(ulong)uVar13);
                goto LAB_001f8f91;
              }
              local_528 = (double)CONCAT44(local_4b8._4_4_,(uint)local_4b8) + local_528;
              uStack_520 = local_4b0 + uStack_520;
              local_518 = local_4a8 + local_518;
            }
            pRVar4 = (*(REF_ADJ *)&pRVar23->naux)->item;
            iVar21 = pRVar4[(int)uVar25].next;
            uVar25 = (ulong)iVar21;
            if (uVar25 == 0xffffffffffffffff) {
              iVar22 = -1;
            }
            else {
              iVar22 = pRVar4[uVar25].ref;
            }
          } while (iVar21 != -1);
          bVar33 = !bVar33;
          pvVar14 = local_5f0;
        }
        uVar13 = ref_math_normalize((REF_DBL *)&local_528);
        if (uVar13 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
                 0x406,"ref_layer_prism_insert_hair",(ulong)uVar13);
          goto LAB_001f8f91;
        }
        RVar28 = (REF_INT)lVar15;
        uVar13 = ref_node_metric_get(pRVar2,RVar28,(REF_DBL *)&local_438);
        if (uVar13 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
                 0x407,"ref_layer_prism_insert_hair",(ulong)uVar13);
          goto LAB_001f8f91;
        }
        dVar34 = (local_410 * local_518 + local_428 * local_528 + uStack_520 * local_418) *
                 local_518 +
                 (local_428 * local_518 +
                 (double)CONCAT44(local_438._4_4_,(uint)local_438) * local_528 +
                 (double)CONCAT44(uStack_42c,local_430) * uStack_520) * local_528 +
                 (local_418 * local_518 +
                 (double)CONCAT44(uStack_42c,local_430) * local_528 + local_420 * uStack_520) *
                 uStack_520;
        if (dVar34 <= 0.0) {
          pcVar24 = "ratio not positive";
          uVar19 = 0x409;
        }
        else {
          if (dVar34 < 0.0) {
            dVar34 = sqrt(dVar34);
          }
          else {
            dVar34 = SQRT(dVar34);
          }
          dVar35 = dVar34 * 1e+20;
          if (dVar35 <= -dVar35) {
            dVar35 = -dVar35;
          }
          if (1.0 < dVar35) {
            local_5c8 = dVar34;
            uVar13 = ref_node_next_global(pRVar2,(REF_GLOB *)&local_5c0);
            if (uVar13 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                     ,0x40d,"ref_layer_prism_insert_hair",(ulong)uVar13);
              goto LAB_001f8f91;
            }
            uVar13 = ref_node_add(pRVar2,CONCAT44(uStack_5bc,local_5c0),&local_608);
            if (uVar13 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                     ,0x40e,"ref_layer_prism_insert_hair",(ulong)uVar13);
              goto LAB_001f8f91;
            }
            dVar34 = 1.0 / local_5c8;
            lVar16 = (long)local_608;
            *(int *)((long)local_618 + lVar15 * 4) = local_608;
            pRVar5 = pRVar2->real;
            pRVar5[lVar16 * 0xf] = local_528 * dVar34 + pRVar5[lVar15 * 0xf];
            pRVar5[lVar16 * 0xf + 1] = uStack_520 * dVar34 + pRVar5[lVar15 * 0xf + 1];
            pRVar5[lVar16 * 0xf + 2] = dVar34 * local_518 + pRVar5[lVar15 * 0xf + 2];
            if (bVar33) {
              uVar13 = ref_cavity_create(&local_5e8);
              pRVar23 = local_600;
              if (uVar13 == 0) {
                uVar13 = ref_cavity_form_insert_tet(local_5e8,ref_grid,local_608,RVar28,-1);
                if (uVar13 == 0) {
                  uVar13 = ref_cavity_enlarge_combined(local_5e8);
                  if (uVar13 == 0) {
                    uVar13 = ref_cavity_replace(local_5e8);
                    if (uVar13 == 0) {
                      uVar13 = ref_cavity_free(local_5e8);
                      if (uVar13 == 0) goto LAB_001f8dce;
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                             ,0x463,"ref_layer_prism_insert_hair",(ulong)uVar13);
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                             ,0x462,"ref_layer_prism_insert_hair",(ulong)uVar13);
                      ref_cavity_tec(local_5e8,"ref_layer_prism_cavity.tec");
                      ref_export_by_extension(ref_grid,"ref_layer_prism_mesh.tec");
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                           ,0x45e,"ref_layer_prism_insert_hair",(ulong)uVar13);
                    ref_cavity_tec(local_5e8,"cav-fail.tec");
                    ref_export_by_extension(ref_grid,"mesh-fail.tec");
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                         ,0x45a,"ref_layer_prism_insert_hair",(ulong)uVar13);
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                       ,0x457,"ref_layer_prism_insert_hair",(ulong)uVar13);
              }
              goto LAB_001f8f91;
            }
            ref_geom = ref_grid->geom;
            uVar10 = ref_geom_tuv(ref_geom,RVar28,2,local_5e0._0_4_,(REF_DBL *)&local_5d8);
            if (uVar10 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                     ,0x41b,"ref_layer_prism_insert_hair",(ulong)uVar10);
              local_620 = uVar10;
            }
            bVar33 = true;
            if (uVar10 == 0) {
              uVar10 = ref_egads_inverse_eval
                                 (ref_geom,2,local_5e0._0_4_,pRVar2->real + (long)local_608 * 0xf,
                                  (REF_DBL *)&local_5d8);
              if (uVar10 == 0) {
                uVar10 = ref_egads_eval_at(ref_geom,2,local_5e0._0_4_,(REF_DBL *)&local_5d8,
                                           pRVar2->real + (long)local_608 * 0xf,(REF_DBL *)0x0);
                if (uVar10 == 0) {
                  uVar10 = ref_geom_add(ref_geom,local_608,2,local_5e0._0_4_,(REF_DBL *)&local_5d8);
                  if (uVar10 == 0) {
                    *(undefined4 *)((long)local_618 + lVar15 * 4) = 0xffffffff;
                    uVar10 = ref_geom_remove_all(ref_geom,local_608);
                    if (uVar10 == 0) {
                      uVar10 = ref_node_remove(pRVar2,local_608);
                      bVar33 = uVar10 != 0;
                      pvVar14 = local_5f0;
                      if (bVar33) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                               ,0x429,"ref_layer_prism_insert_hair",(ulong)uVar10);
                        pvVar14 = local_5f0;
                        local_620 = uVar10;
                      }
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                             ,0x428,"ref_layer_prism_insert_hair",(ulong)uVar10);
                      local_620 = uVar10;
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                           ,0x425,"ref_layer_prism_insert_hair",(ulong)uVar10);
                    local_620 = uVar10;
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                         ,0x422,"ref_layer_prism_insert_hair",(ulong)uVar10);
                  local_620 = uVar10;
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                       ,0x41e,"ref_layer_prism_insert_hair",(ulong)uVar10);
                local_620 = uVar10;
              }
            }
            pRVar23 = local_600;
            uVar13 = local_620;
            if (bVar33) goto LAB_001f8f91;
            goto LAB_001f8dce;
          }
          pcVar24 = "1/ratio is inf 1/0";
          uVar19 = 0x40b;
        }
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               uVar19,"ref_layer_prism_insert_hair",pcVar24);
        uVar13 = 1;
        goto LAB_001f8f91;
      }
LAB_001f8dce:
      lVar15 = lVar15 + 1;
      if (pRVar2->max <= lVar15) goto LAB_001f8f52;
      goto LAB_001f863b;
    }
LAB_001f8f52:
    uVar13 = 0;
LAB_001f8f91:
    if (uVar13 == 0) {
      if (0 < pRVar17->max) {
        iVar22 = 0;
        do {
          RVar11 = ref_cell_nodes(pRVar17,iVar22,local_5a8);
          if ((((RVar11 == 0) && (*(int *)((long)local_618 + (long)local_5a8[0] * 4) != -1)) &&
              (*(int *)((long)local_618 + (long)local_5a8[1] * 4) != -1)) &&
             (*(int *)((long)local_618 + (long)local_5a8[2] * 4) != -1)) {
            local_601 = 0 < pRVar17->edge_per;
            if (0 < pRVar17->edge_per) {
              local_440 = (long)iVar22;
              lVar15 = 0;
              local_5ac = iVar22;
              do {
                lVar16 = pRVar17->size_per * local_440;
                uVar10 = *(uint *)((long)local_618 +
                                  (long)pRVar17->c2n[pRVar17->e2n[lVar15 * 2] + lVar16] * 4);
                RVar28 = *(REF_INT *)
                          ((long)local_618 +
                          (long)pRVar17->c2n[(long)(int)lVar16 + (long)pRVar17->e2n[lVar15 * 2 + 1]]
                          * 4);
                local_5f8 = (REF_DICT)CONCAT44(local_5f8._4_4_,RVar28);
                uVar13 = ref_cell_has_side(ref_grid->cell[8],uVar10,RVar28,(REF_BOOL *)&local_528);
                if (uVar13 == 0) {
                  bVar33 = true;
                  if ((int)local_528 == 0) {
                    pRVar7 = ref_grid->cell[8];
                    uVar25 = 0xffffffff;
                    if (-1 < (int)uVar10) {
                      uVar25 = 0xffffffff;
                      if ((int)uVar10 < pRVar7->ref_adj->nnode) {
                        uVar25 = (ulong)(uint)pRVar7->ref_adj->first[uVar10];
                      }
                    }
                    if ((int)uVar25 == -1) {
                      iVar22 = -1;
                      bVar33 = false;
                    }
                    else {
                      iVar22 = pRVar7->ref_adj->item[(int)uVar25].ref;
                      local_600 = ref_grid->node;
                      local_5b4 = -1;
                      dVar34 = -1e+200;
                      do {
                        if (0 < pRVar7->face_per) {
                          lVar27 = 4;
                          lVar16 = 0;
                          local_5b0 = iVar22;
                          local_530 = uVar25;
                          do {
                            pRVar9 = pRVar7->f2n;
                            pRVar6 = pRVar7->c2n;
                            lVar26 = (long)iVar22;
                            lVar18 = pRVar7->size_per * lVar26;
                            if (((pRVar6[*(int *)((long)pRVar9 + lVar27 + -4) + lVar18] != uVar10)
                                && (lVar18 = (long)(int)lVar18,
                                   pRVar6[*(int *)((long)pRVar9 + lVar27) + lVar18] != uVar10)) &&
                               (pRVar6[*(int *)((long)pRVar9 + lVar27 + 4) + lVar18] != uVar10)) {
                              local_438._4_4_ = (int)local_5f8;
                              local_430 = pRVar6[*(int *)((long)pRVar9 + lVar27) + lVar18];
                              uStack_42c = pRVar6[pRVar7->size_per * lVar26 +
                                                  (long)*(int *)((long)pRVar9 + lVar27 + -4)];
                              local_5e0 = dVar34;
                              local_438._0_4_ = uVar10;
                              uVar13 = ref_node_tet_vol(local_600,(REF_INT *)&local_438,
                                                        (REF_DBL *)&local_4b8);
                              if (uVar13 == 0) {
                                dVar35 = 1e+200;
                                if ((double)CONCAT44(local_4b8._4_4_,(uint)local_4b8) <= 1e+200) {
                                  dVar35 = (double)CONCAT44(local_4b8._4_4_,(uint)local_4b8);
                                }
                                local_438._4_4_ = (int)local_5f8;
                                local_430 = pRVar7->c2n
                                            [pRVar7->size_per * lVar26 +
                                             (long)*(int *)((long)pRVar7->f2n + lVar27 + 4)];
                                uStack_42c = pRVar7->c2n
                                             [pRVar7->size_per * lVar26 +
                                              (long)*(int *)((long)pRVar7->f2n + lVar27)];
                                local_438._0_4_ = uVar10;
                                uVar13 = ref_node_tet_vol(local_600,(REF_INT *)&local_438,
                                                          (REF_DBL *)&local_4b8);
                                if (uVar13 == 0) {
                                  if ((double)CONCAT44(local_4b8._4_4_,(uint)local_4b8) <= dVar35) {
                                    dVar35 = (double)CONCAT44(local_4b8._4_4_,(uint)local_4b8);
                                  }
                                  local_438._4_4_ = (int)local_5f8;
                                  local_430 = pRVar7->c2n
                                              [pRVar7->size_per * lVar26 +
                                               (long)*(int *)((long)pRVar7->f2n + lVar27 + -4)];
                                  uStack_42c = pRVar7->c2n
                                               [pRVar7->size_per * lVar26 +
                                                (long)*(int *)((long)pRVar7->f2n + lVar27 + 4)];
                                  local_438._0_4_ = uVar10;
                                  uVar13 = ref_node_tet_vol(local_600,(REF_INT *)&local_438,
                                                            (REF_DBL *)&local_4b8);
                                  if (uVar13 == 0) {
                                    if ((double)CONCAT44(local_4b8._4_4_,(uint)local_4b8) <= dVar35)
                                    {
                                      dVar35 = (double)CONCAT44(local_4b8._4_4_,(uint)local_4b8);
                                    }
                                    uVar25 = local_530;
                                    dVar34 = local_5e0;
                                    iVar22 = local_5b0;
                                    if (local_5e0 < dVar35) {
                                      local_5b4 = local_5b0;
                                      dVar34 = dVar35;
                                    }
                                    goto LAB_001f91ed;
                                  }
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                         ,0x34f,"ref_layer_seed_tet",(ulong)uVar13,"vol");
                                  local_5c8 = (double)CONCAT44(local_5c8._4_4_,uVar13);
                                }
                                else {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                         ,0x349,"ref_layer_seed_tet",(ulong)uVar13,"vol");
                                  local_5c8 = (double)CONCAT44(local_5c8._4_4_,uVar13);
                                }
                              }
                              else {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                       ,0x343,"ref_layer_seed_tet",(ulong)uVar13,"vol");
                                local_5c8 = (double)CONCAT44(local_5c8._4_4_,uVar13);
                              }
                              iVar22 = -1;
                              uVar25 = (ulong)local_5c8 & 0xffffffff;
                              goto LAB_001f957b;
                            }
LAB_001f91ed:
                            lVar16 = lVar16 + 1;
                            lVar27 = lVar27 + 0x10;
                          } while (lVar16 < pRVar7->face_per);
                        }
                        pRVar4 = pRVar7->ref_adj->item;
                        iVar21 = pRVar4[(int)uVar25].next;
                        uVar25 = (ulong)iVar21;
                        if (uVar25 == 0xffffffffffffffff) {
                          iVar22 = -1;
                        }
                        else {
                          iVar22 = pRVar4[uVar25].ref;
                        }
                      } while (iVar21 != -1);
                      bVar33 = 0.0 < dVar34;
                      iVar22 = local_5b4;
                    }
                    if (iVar22 == -1) {
                      uVar19 = 0x357;
                      pcVar24 = "best tet empty";
LAB_001f9564:
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                             ,uVar19,"ref_layer_seed_tet",pcVar24);
                      uVar25 = 1;
                      iVar22 = -1;
                    }
                    else {
                      uVar25 = 0;
                      if (!bVar33) {
                        uVar19 = 0x358;
                        pcVar24 = "best vol not positive";
                        goto LAB_001f9564;
                      }
                    }
LAB_001f957b:
                    if ((uint)uVar25 == 0) {
                      uVar10 = ref_cavity_create((REF_CAVITY *)&local_438);
                      if (uVar10 == 0) {
                        uVar10 = ref_cavity_form_empty
                                           ((REF_CAVITY)CONCAT44(local_438._4_4_,(uint)local_438),
                                            ref_grid,(int)local_5f8);
                        if (uVar10 == 0) {
                          uVar10 = ref_cavity_add_tet((REF_CAVITY)
                                                      CONCAT44(local_438._4_4_,(uint)local_438),
                                                      iVar22);
                          if (uVar10 == 0) {
                            if ((ulong)*(uint *)CONCAT44(local_438._4_4_,(uint)local_438) == 0) {
                              uVar10 = ref_cavity_enlarge_visible
                                                 ((REF_CAVITY)
                                                  CONCAT44(local_438._4_4_,(uint)local_438));
                              if (uVar10 == 0) {
                                uVar10 = *(uint *)CONCAT44(local_438._4_4_,(uint)local_438);
                                if ((ulong)uVar10 != 1) {
                                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                         ,0x4a5,"ref_layer_align_prism","prism top not visible",1,
                                         (ulong)uVar10);
                                  ref_cavity_tec((REF_CAVITY)
                                                 CONCAT44(local_438._4_4_,(uint)local_438),
                                                 "ref_layer_prism_cavity.tec");
                                  ref_export_by_extension(ref_grid,"ref_layer_prism_mesh.tec");
                                  local_634 = 1;
                                }
                                if (uVar10 == 1) {
                                  uVar10 = ref_cavity_replace((REF_CAVITY)
                                                              CONCAT44(local_438._4_4_,
                                                                       (uint)local_438));
                                  if (uVar10 == 0) {
                                    uVar10 = ref_cavity_free((REF_CAVITY)
                                                             CONCAT44(local_438._4_4_,
                                                                      (uint)local_438));
                                    bVar33 = uVar10 == 0;
                                    if (!bVar33) {
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                             ,0x4aa,"ref_layer_align_prism",(ulong)uVar10,"cav free"
                                            );
                                      local_634 = uVar10;
                                    }
                                    goto LAB_001f95bc;
                                  }
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                         ,0x4a9,"ref_layer_align_prism",(ulong)uVar10,"cav replace")
                                  ;
                                  ref_cavity_tec((REF_CAVITY)
                                                 CONCAT44(local_438._4_4_,(uint)local_438),
                                                 "ref_layer_prism_cavity.tec");
                                  ref_export_by_extension(ref_grid,"ref_layer_prism_mesh.tec");
                                  local_634 = uVar10;
                                }
                                bVar33 = false;
                                goto LAB_001f95bc;
                              }
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                     ,0x4a0,"ref_layer_align_prism",(ulong)uVar10,"enlarge");
                              ref_cavity_tec((REF_CAVITY)CONCAT44(local_438._4_4_,(uint)local_438),
                                             "cav-fail.tec");
                              ref_export_by_extension(ref_grid,"mesh-fail.tec");
                              local_634 = uVar10;
                            }
                            else {
                              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                     ,0x49c,"ref_layer_align_prism","add tet not unknown",0,
                                     (ulong)*(uint *)CONCAT44(local_438._4_4_,(uint)local_438));
                              local_634 = 1;
                            }
                          }
                          else {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                   ,0x49a,"ref_layer_align_prism",(ulong)uVar10,"add tet");
                            local_634 = uVar10;
                          }
                        }
                        else {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                 ,0x499,"ref_layer_align_prism",(ulong)uVar10,"empty");
                          local_634 = uVar10;
                        }
                      }
                      else {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                               ,0x498,"ref_layer_align_prism",(ulong)uVar10,"cav create");
                        local_634 = uVar10;
                      }
                      goto LAB_001f90fb;
                    }
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                           ,0x497,"ref_layer_align_prism",uVar25,"seed");
                    bVar33 = false;
                    local_634 = (uint)uVar25;
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                         ,0x493,"ref_layer_align_prism",(ulong)uVar13,"find tet side");
                  local_634 = uVar13;
LAB_001f90fb:
                  bVar33 = false;
                }
LAB_001f95bc:
                iVar22 = local_5ac;
                if (!bVar33) break;
                lVar15 = lVar15 + 1;
                local_601 = lVar15 < pRVar17->edge_per;
              } while (lVar15 < pRVar17->edge_per);
            }
            if ((local_601 & 1U) != 0) {
              return local_634;
            }
          }
          iVar22 = iVar22 + 1;
        } while (iVar22 < pRVar17->max);
      }
      bVar33 = 0 < pRVar17->max;
      if (0 < pRVar17->max) {
        iVar22 = 0;
        do {
          RVar11 = ref_cell_nodes(pRVar17,iVar22,local_5a8);
          if (((RVar11 == 0) && (*(int *)((long)local_618 + (long)local_5a8[0] * 4) != -1)) &&
             ((*(int *)((long)local_618 + (long)local_5a8[1] * 4) != -1 &&
              ((*(int *)((long)local_618 + (long)local_5a8[2] * 4) != -1 && (0 < pRVar17->edge_per))
              )))) {
            local_600 = (REF_NODE)(long)iVar22;
            lVar15 = 0;
            do {
              pRVar2 = local_600;
              lVar16 = (long)pRVar17->size_per * (long)local_600;
              uVar10 = ref_cell_has_side(ref_grid->cell[8],
                                         pRVar17->c2n[pRVar17->e2n[lVar15 * 2] + lVar16],
                                         *(REF_INT *)
                                          ((long)local_618 +
                                          (long)pRVar17->c2n
                                                [(long)(int)lVar16 +
                                                 (long)pRVar17->e2n[lVar15 * 2 + 1]] * 4),
                                         (REF_BOOL *)&local_5d8);
              if (uVar10 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                       ,0x4c1,"ref_layer_align_prism",(ulong)uVar10,"diag");
                local_634 = uVar10;
                goto LAB_001f9dca;
              }
              if ((int)local_5d8 == 0) {
                uVar10 = 0xffffffff;
                iVar21 = -1;
                local_5f8 = (REF_DICT)CONCAT44(local_5f8._4_4_,0xffffffff);
                RVar28 = -1;
              }
              else {
                lVar16 = (long)pRVar17->size_per * (long)pRVar2;
                uVar10 = pRVar17->c2n[pRVar17->e2n[lVar15 * 2] + lVar16];
                iVar21 = pRVar17->c2n[(long)(int)lVar16 + (long)pRVar17->e2n[lVar15 * 2 + 1]];
                local_5f8 = (REF_DICT)
                            CONCAT44(local_5f8._4_4_,
                                     *(undefined4 *)((long)local_618 + (long)iVar21 * 4));
                RVar28 = *(REF_INT *)((long)local_618 + (long)(int)uVar10 * 4);
              }
              lVar16 = (long)pRVar17->size_per * (long)pRVar2;
              uVar13 = ref_cell_has_side(ref_grid->cell[8],
                                         pRVar17->c2n[pRVar17->e2n[lVar15 * 2 + 1] + lVar16],
                                         *(REF_INT *)
                                          ((long)local_618 +
                                          (long)pRVar17->c2n
                                                [(long)(int)lVar16 + (long)pRVar17->e2n[lVar15 * 2]]
                                          * 4),(REF_BOOL *)&local_5d8);
              if (uVar13 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                       ,0x4cd,"ref_layer_align_prism",(ulong)uVar13,"diag");
                local_634 = uVar13;
                goto LAB_001f9dca;
              }
              if ((int)local_5d8 != 0) {
                lVar16 = (long)pRVar17->size_per * (long)local_600;
                uVar10 = pRVar17->c2n[pRVar17->e2n[lVar15 * 2 + 1] + lVar16];
                iVar21 = pRVar17->c2n[(long)(int)lVar16 + (long)pRVar17->e2n[lVar15 * 2]];
                local_5f8 = (REF_DICT)
                            CONCAT44(local_5f8._4_4_,
                                     *(undefined4 *)((long)local_618 + (long)iVar21 * 4));
                RVar28 = *(REF_INT *)((long)local_618 + (long)(int)uVar10 * 4);
              }
              if (uVar10 == 0xffffffff) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                       ,0x4d4,"ref_layer_align_prism","diag not found");
                local_634 = 1;
                goto LAB_001f9dca;
              }
              local_430 = (int)local_5f8;
              local_438._0_4_ = uVar10;
              local_438._4_4_ = iVar21;
              uStack_42c = uVar10;
              uVar13 = ref_cell_with_face(ref_grid->cell[8],(REF_INT *)&local_438,
                                          (REF_INT *)&local_4b8,(REF_INT *)&local_528);
              if (uVar13 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                       ,0x4db,"ref_layer_align_prism",(ulong)uVar13,"tets");
                local_634 = uVar13;
                goto LAB_001f9dca;
              }
              if (((uint)local_4b8 == 0xffffffff) && ((int)local_528 == -1)) {
                uVar13 = ref_layer_recover_face(ref_grid,(REF_INT *)&local_438);
                if (uVar13 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                         ,0x4dd,"ref_layer_align_prism",(ulong)uVar13,"recover upper");
                  local_634 = uVar13;
                  goto LAB_001f9dca;
                }
                printf("lower tets %d %d\n",(ulong)(uint)local_4b8,(ulong)local_528 & 0xffffffff);
              }
              local_438._4_4_ = (int)local_5f8;
              local_438._0_4_ = uVar10;
              local_430 = RVar28;
              uStack_42c = uVar10;
              uVar10 = ref_cell_with_face(ref_grid->cell[8],(REF_INT *)&local_438,
                                          (REF_INT *)&local_4b8,(REF_INT *)&local_528);
              if (uVar10 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                       ,0x4e6,"ref_layer_align_prism",(ulong)uVar10,"tets");
                local_634 = uVar10;
                goto LAB_001f9dca;
              }
              if (((uint)local_4b8 == 0xffffffff) && ((int)local_528 == -1)) {
                uVar10 = ref_layer_recover_face(ref_grid,(REF_INT *)&local_438);
                if (uVar10 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                         ,0x4e8,"ref_layer_align_prism",(ulong)uVar10,"recover upper");
                  local_634 = uVar10;
                  goto LAB_001f9dca;
                }
                printf("upper tets %d %d\n",(ulong)(uint)local_4b8,(ulong)local_528 & 0xffffffff);
              }
              lVar15 = lVar15 + 1;
            } while (lVar15 < pRVar17->edge_per);
          }
          iVar22 = iVar22 + 1;
          bVar33 = iVar22 < pRVar17->max;
        } while (iVar22 < pRVar17->max);
      }
LAB_001f9dca:
      if (!bVar33) {
        bVar33 = 0 < pRVar17->max;
        pvVar14 = local_5f0;
        if (0 < pRVar17->max) {
          iVar22 = 0;
          do {
            RVar11 = ref_cell_nodes(pRVar17,iVar22,local_5a8);
            if ((((RVar11 == 0) && (*(int *)((long)local_618 + (long)local_5a8[0] * 4) != -1)) &&
                (*(int *)((long)local_618 + (long)local_5a8[1] * 4) != -1)) &&
               ((*(int *)((long)local_618 + (long)local_5a8[2] * 4) != -1 && (0 < pRVar17->edge_per)
                ))) {
              local_600 = (REF_NODE)(long)iVar22;
              lVar15 = 0;
              do {
                lVar16 = (long)pRVar17->size_per * (long)local_600;
                iVar21 = pRVar17->c2n[pRVar17->e2n[lVar15 * 2] + lVar16];
                iVar1 = pRVar17->c2n[(long)(int)lVar16 + (long)pRVar17->e2n[lVar15 * 2 + 1]];
                RVar28 = *(REF_INT *)((long)local_618 + (long)iVar1 * 4);
                local_5f8 = (REF_DICT)
                            CONCAT44(local_5f8._4_4_,
                                     *(undefined4 *)((long)local_618 + (long)iVar21 * 4));
                uVar10 = ref_cell_has_side(ref_grid->cell[8],iVar21,RVar28,(REF_BOOL *)&local_4b8);
                if (uVar10 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                         ,0x4fe,"ref_layer_align_prism",(ulong)uVar10,"diag02");
                  pvVar14 = local_5f0;
                  local_634 = uVar10;
                  goto LAB_001fa192;
                }
                uVar10 = ref_cell_has_side(ref_grid->cell[8],iVar1,(int)local_5f8,
                                           (REF_BOOL *)&local_528);
                if (uVar10 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                         ,0x501,"ref_layer_align_prism",(ulong)uVar10,"diag13");
                  pvVar14 = local_5f0;
                  local_634 = uVar10;
                  goto LAB_001fa192;
                }
                if (((uint)local_4b8 != 0) && ((int)local_528 != 0)) {
                  puts("sliver");
                  uVar10 = ref_layer_swap(ref_grid,iVar21,RVar28,iVar1,(REF_BOOL *)&local_438);
                  if (uVar10 == 0) {
                    if ((uint)local_438 == 0) {
                      uVar10 = ref_layer_swap(ref_grid,iVar21,RVar28,(int)local_5f8,
                                              (REF_BOOL *)&local_438);
                      if (uVar10 == 0) {
                        if ((uint)local_438 != 0) goto LAB_001f9fef;
                        uVar10 = ref_layer_swap(ref_grid,iVar1,(int)local_5f8,iVar21,
                                                (REF_BOOL *)&local_438);
                        if (uVar10 == 0) {
                          if ((uint)local_438 != 0) goto LAB_001f9fef;
                          uVar13 = ref_layer_swap(ref_grid,iVar1,(int)local_5f8,RVar28,
                                                  (REF_BOOL *)&local_438);
                          uVar10 = 0;
                          if (uVar13 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                   ,0x3d6,"ref_layer_remove_sliver",(ulong)uVar13,"quad3");
                            uVar10 = uVar13;
                          }
                        }
                        else {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                 ,0x3d4,"ref_layer_remove_sliver",(ulong)uVar10,"quad0");
                        }
                      }
                      else {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                               ,0x3d2,"ref_layer_remove_sliver",(ulong)uVar10,"quad1");
                      }
                    }
                    else {
LAB_001f9fef:
                      uVar10 = 0;
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                           ,0x3d0,"ref_layer_remove_sliver",(ulong)uVar10,"quad1");
                  }
                  if (uVar10 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                           ,0x504,"ref_layer_align_prism",(ulong)uVar10,"remove sliver");
                    pvVar14 = local_5f0;
                    local_634 = uVar10;
                    goto LAB_001fa192;
                  }
                }
                lVar15 = lVar15 + 1;
                pvVar14 = local_5f0;
              } while (lVar15 < pRVar17->edge_per);
            }
            iVar22 = iVar22 + 1;
            bVar33 = iVar22 < pRVar17->max;
          } while (iVar22 < pRVar17->max);
        }
LAB_001fa192:
        if (!bVar33) {
          uVar10 = ref_adj_create((REF_ADJ *)&local_5d8);
          if (uVar10 == 0) {
            if (0 < pRVar17->max) {
              uVar25 = 0;
              do {
                RVar28 = (REF_INT)uVar25;
                RVar11 = ref_cell_nodes(pRVar17,RVar28,local_5a8);
                if (RVar11 == 0) {
                  iVar22 = *(int *)((long)local_618 + (long)local_5a8[0] * 4);
                  if (((iVar22 != -1) &&
                      (iVar21 = *(int *)((long)local_618 + (long)local_5a8[1] * 4), iVar21 != -1))
                     && (iVar1 = *(int *)((long)local_618 + (long)local_5a8[2] * 4), iVar1 != -1)) {
                    pRVar7 = ref_grid->cell[8];
                    local_528 = (double)CONCAT44(local_5a8[1],local_5a8[0]);
                    uStack_520 = (double)CONCAT44(iVar22,local_5a8[2]);
                    local_518 = (double)CONCAT44(iVar1,iVar21);
                    RVar20 = -1;
                    uVar29 = 0xffffffff;
                    if (-1 < local_5a8[0]) {
                      uVar29 = 0xffffffff;
                      if (local_5a8[0] < pRVar7->ref_adj->nnode) {
                        uVar29 = (ulong)(uint)pRVar7->ref_adj->first[local_5a8[0]];
                      }
                    }
                    if ((int)uVar29 != -1) {
                      RVar20 = pRVar7->ref_adj->item[(int)uVar29].ref;
                    }
                    while ((int)uVar29 != -1) {
                      if (0 < pRVar7->node_per) {
                        lVar15 = 0;
                        do {
                          if (*(int *)((long)local_618 + (long)local_5a8[0] * 4) ==
                              pRVar7->c2n[(long)RVar20 * (long)pRVar7->size_per + lVar15]) {
                            uVar10 = ref_cell_nodes(pRVar7,RVar20,(REF_INT *)&local_4b8);
                            if (uVar10 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                     ,0x51e,"ref_layer_align_prism",(ulong)uVar10,"tet");
                              local_634 = uVar10;
                              goto LAB_001fa810;
                            }
                            uVar10 = ref_layer_tet_prism((REF_INT *)&local_528,(REF_INT *)&local_4b8
                                                         ,&local_608);
                            if (uVar10 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                     ,0x51f,"ref_layer_align_prism",(ulong)uVar10,"contains");
                              local_634 = uVar10;
                              goto LAB_001fa7b9;
                            }
                            if ((local_608 != 0) &&
                               (uVar10 = ref_adj_add_uniquely
                                                   ((REF_ADJ)CONCAT44(local_5d8._4_4_,(int)local_5d8
                                                                     ),RVar28,RVar20), uVar10 != 0))
                            {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                     ,0x521,"ref_layer_align_prism",(ulong)uVar10,"add");
                              local_634 = uVar10;
                              goto LAB_001fa810;
                            }
                          }
                          lVar15 = lVar15 + 1;
                        } while ((int)lVar15 < pRVar7->node_per);
                      }
                      pRVar4 = pRVar7->ref_adj->item;
                      uVar29 = (ulong)pRVar4[(int)uVar29].next;
                      if (uVar29 == 0xffffffffffffffff) {
                        RVar20 = -1;
                      }
                      else {
                        RVar20 = pRVar4[uVar29].ref;
                      }
                    }
                    RVar20 = -1;
                    uVar29 = 0xffffffff;
                    if (-1 < (long)local_5a8[1]) {
                      uVar29 = 0xffffffff;
                      if (local_5a8[1] < pRVar7->ref_adj->nnode) {
                        uVar29 = (ulong)(uint)pRVar7->ref_adj->first[local_5a8[1]];
                      }
                    }
                    if ((int)uVar29 != -1) {
                      RVar20 = pRVar7->ref_adj->item[(int)uVar29].ref;
                    }
                    while ((int)uVar29 != -1) {
                      if (0 < pRVar7->node_per) {
                        lVar15 = 0;
                        do {
                          if (*(int *)((long)local_618 + (long)local_5a8[1] * 4) ==
                              pRVar7->c2n[(long)RVar20 * (long)pRVar7->size_per + lVar15]) {
                            uVar10 = ref_cell_nodes(pRVar7,RVar20,(REF_INT *)&local_4b8);
                            if (uVar10 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                     ,0x526,"ref_layer_align_prism",(ulong)uVar10,"tet");
                              local_634 = uVar10;
                              goto LAB_001fa810;
                            }
                            uVar10 = ref_layer_tet_prism((REF_INT *)&local_528,(REF_INT *)&local_4b8
                                                         ,&local_608);
                            if (uVar10 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                     ,0x527,"ref_layer_align_prism",(ulong)uVar10,"contains");
                              local_634 = uVar10;
                              goto LAB_001fa7b9;
                            }
                            if ((local_608 != 0) &&
                               (uVar10 = ref_adj_add_uniquely
                                                   ((REF_ADJ)CONCAT44(local_5d8._4_4_,(int)local_5d8
                                                                     ),RVar28,RVar20), uVar10 != 0))
                            {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                     ,0x529,"ref_layer_align_prism",(ulong)uVar10,"add");
                              local_634 = uVar10;
                              goto LAB_001fa810;
                            }
                          }
                          lVar15 = lVar15 + 1;
                        } while ((int)lVar15 < pRVar7->node_per);
                      }
                      pRVar4 = pRVar7->ref_adj->item;
                      uVar29 = (ulong)pRVar4[(int)uVar29].next;
                      if (uVar29 == 0xffffffffffffffff) {
                        RVar20 = -1;
                      }
                      else {
                        RVar20 = pRVar4[uVar29].ref;
                      }
                    }
                    RVar20 = -1;
                    uVar29 = 0xffffffff;
                    if (-1 < (long)local_5a8[2]) {
                      uVar29 = 0xffffffff;
                      if (local_5a8[2] < pRVar7->ref_adj->nnode) {
                        uVar29 = (ulong)(uint)pRVar7->ref_adj->first[local_5a8[2]];
                      }
                    }
                    if ((int)uVar29 != -1) {
                      RVar20 = pRVar7->ref_adj->item[(int)uVar29].ref;
                    }
                    while ((int)uVar29 != -1) {
                      if (0 < pRVar7->node_per) {
                        lVar15 = 0;
LAB_001fa65e:
                        if (*(int *)((long)local_618 + (long)local_5a8[2] * 4) !=
                            pRVar7->c2n[(long)RVar20 * (long)pRVar7->size_per + lVar15])
                        goto LAB_001fa783;
                        uVar10 = ref_cell_nodes(pRVar7,RVar20,(REF_INT *)&local_4b8);
                        if (uVar10 == 0) {
                          uVar10 = ref_layer_tet_prism((REF_INT *)&local_528,(REF_INT *)&local_4b8,
                                                       &local_608);
                          if (uVar10 == 0) {
                            if ((local_608 == 0) ||
                               (uVar10 = ref_adj_add_uniquely
                                                   ((REF_ADJ)CONCAT44(local_5d8._4_4_,(int)local_5d8
                                                                     ),RVar28,RVar20), uVar10 == 0))
                            goto LAB_001fa783;
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                   ,0x531,"ref_layer_align_prism",(ulong)uVar10,"add");
                            local_634 = uVar10;
LAB_001fa7b9:
                            bVar33 = false;
                            goto LAB_001fa81c;
                          }
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                 ,0x52f,"ref_layer_align_prism",(ulong)uVar10,"contains");
                          local_634 = uVar10;
                        }
                        else {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                 ,0x52e,"ref_layer_align_prism",(ulong)uVar10,"tet");
                          local_634 = uVar10;
                        }
                        goto LAB_001fa810;
                      }
LAB_001fa790:
                      pRVar4 = pRVar7->ref_adj->item;
                      uVar29 = (ulong)pRVar4[(int)uVar29].next;
                      if (uVar29 == 0xffffffffffffffff) {
                        RVar20 = -1;
                      }
                      else {
                        RVar20 = pRVar4[uVar29].ref;
                      }
                    }
                    uVar10 = ref_adj_degree((REF_ADJ)CONCAT44(local_5d8._4_4_,(int)local_5d8),RVar28
                                            ,(REF_INT *)&local_5c0);
                    if (uVar10 == 0) {
                      if (local_5c0 != 3) {
                        uVar10 = ref_cavity_create(&local_5e8);
                        if (uVar10 == 0) {
                          uVar10 = ref_cavity_form_empty(local_5e8,ref_grid,-1);
                          if (uVar10 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                   ,0x53a,"ref_layer_align_prism",(ulong)uVar10,"empty");
                            local_634 = uVar10;
                            goto LAB_001fa9fd;
                          }
                          piVar8 = (int *)CONCAT44(local_5d8._4_4_,(int)local_5d8);
                          RVar28 = -1;
                          uVar29 = 0xffffffff;
                          if ((long)uVar25 < (long)*piVar8) {
                            uVar29 = (ulong)*(uint *)(*(long *)(piVar8 + 2) + uVar25 * 4);
                          }
                          if ((int)uVar29 != -1) {
                            RVar28 = *(REF_INT *)(*(long *)(piVar8 + 4) + 4 + (long)(int)uVar29 * 8)
                            ;
                          }
                          while ((int)uVar29 != -1) {
                            uVar10 = ref_cavity_add_tet(local_5e8,RVar28);
                            if (uVar10 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                     ,0x53c,"ref_layer_align_prism",(ulong)uVar10,"add tet");
                              local_634 = uVar10;
                              goto LAB_001fa9fd;
                            }
                            lVar15 = *(long *)(CONCAT44(local_5d8._4_4_,(int)local_5d8) + 0x10);
                            uVar29 = (ulong)*(int *)(lVar15 + (long)(int)uVar29 * 8);
                            if (uVar29 == 0xffffffffffffffff) {
                              RVar28 = -1;
                            }
                            else {
                              RVar28 = *(REF_INT *)(lVar15 + 4 + uVar29 * 8);
                            }
                          }
                          snprintf((char *)&local_438,0x400,"prism-%d-cav.tec",uVar25 & 0xffffffff);
                          printf("prism tets %d %s\n",(ulong)local_5c0,&local_438);
                          uVar10 = ref_cavity_tec(local_5e8,(char *)&local_438);
                          if (uVar10 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                   ,0x540,"ref_layer_align_prism",(ulong)uVar10,"cav tec");
                            local_634 = uVar10;
                            goto LAB_001fa9fd;
                          }
                          uVar10 = ref_cavity_free(local_5e8);
                          bVar33 = uVar10 == 0;
                          if (!bVar33) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                   ,0x541,"ref_layer_align_prism",(ulong)uVar10,"cav free");
                            local_634 = uVar10;
                          }
                        }
                        else {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                 ,0x539,"ref_layer_align_prism",(ulong)uVar10,"cav create");
                          local_634 = uVar10;
LAB_001fa9fd:
                          bVar33 = false;
                        }
                        if (!bVar33) goto LAB_001fa810;
                      }
                      bVar33 = true;
                      if (local_5c0 == 3) {
                        piVar8 = (int *)CONCAT44(local_5d8._4_4_,(int)local_5d8);
                        uVar29 = 0xffffffff;
                        if ((long)uVar25 < (long)*piVar8) {
                          uVar29 = (ulong)*(uint *)(*(long *)(piVar8 + 2) + uVar25 * 4);
                        }
                        if ((int)uVar29 != -1) {
                          RVar28 = *(REF_INT *)(*(long *)(piVar8 + 4) + 4 + (long)(int)uVar29 * 8);
                          do {
                            uVar10 = ref_cell_remove(ref_grid->cell[8],RVar28);
                            if (uVar10 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                     ,0x546,"ref_layer_align_prism",(ulong)uVar10,"rm tet");
                              local_634 = uVar10;
                              goto LAB_001fa810;
                            }
                            lVar15 = *(long *)(CONCAT44(local_5d8._4_4_,(int)local_5d8) + 0x10);
                            iVar22 = *(int *)(lVar15 + (long)(int)uVar29 * 8);
                            uVar29 = (ulong)iVar22;
                            if (uVar29 == 0xffffffffffffffff) {
                              RVar28 = -1;
                            }
                            else {
                              RVar28 = *(REF_INT *)(lVar15 + 4 + uVar29 * 8);
                            }
                          } while (iVar22 != -1);
                        }
                        uVar10 = ref_cell_add(ref_grid->cell[10],(REF_INT *)&local_528,
                                              (REF_INT *)&local_438);
                        bVar33 = uVar10 == 0;
                        if (!bVar33) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                 ,0x549,"ref_layer_align_prism",(ulong)uVar10,"add pri");
                          local_634 = uVar10;
                        }
                      }
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                             ,0x535,"ref_layer_align_prism",(ulong)uVar10,"deg");
                      local_634 = uVar10;
LAB_001fa810:
                      bVar33 = false;
                    }
LAB_001fa81c:
                    if (!bVar33) {
                      bVar33 = false;
                      pvVar14 = local_5f0;
                      goto LAB_001fabbe;
                    }
                  }
                }
                uVar25 = uVar25 + 1;
              } while ((long)uVar25 < (long)pRVar17->max);
            }
            uVar10 = ref_adj_free((REF_ADJ)CONCAT44(local_5d8._4_4_,(int)local_5d8));
            bVar33 = uVar10 == 0;
            pvVar14 = local_5f0;
            if (!bVar33) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                     ,0x54d,"ref_layer_align_prism",(ulong)uVar10,"free");
              pvVar14 = local_5f0;
              local_634 = uVar10;
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                   ,0x50e,"ref_layer_align_prism",(ulong)uVar10,"tet list");
            bVar33 = false;
            local_634 = uVar10;
          }
LAB_001fabbe:
          if (bVar33) {
            pRVar17 = ref_grid->cell[10];
            if (0 < pRVar17->max) {
              iVar22 = 0;
              do {
                RVar11 = ref_cell_nodes(pRVar17,iVar22,local_5a8);
                if (RVar11 == 0) {
                  iVar21 = ref_grid->cell[10]->face_per;
                  bVar33 = 0 < iVar21;
                  if (0 < iVar21) {
                    lVar15 = (long)iVar22;
                    pRVar30 = (REF_DICT)0x0;
                    do {
                      uVar10 = ref_cavity_create((REF_CAVITY *)&local_4b8);
                      if (uVar10 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                               ,0x555,"ref_layer_align_prism",(ulong)uVar10,"cav create");
                        local_634 = uVar10;
                        break;
                      }
                      uVar10 = ref_cavity_form_empty
                                         ((REF_CAVITY)CONCAT44(local_4b8._4_4_,(uint)local_4b8),
                                          ref_grid,-1);
                      if (uVar10 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                               ,0x556,"ref_layer_align_prism",(ulong)uVar10,"empty");
                        local_634 = uVar10;
                        break;
                      }
                      pRVar17 = ref_grid->cell[10];
                      pRVar2 = (REF_NODE)((long)pRVar30 * 4);
                      lVar16 = pRVar17->size_per * lVar15;
                      uVar10 = pRVar17->c2n[pRVar17->f2n[(long)pRVar30 * 4] + lVar16];
                      local_5f8 = pRVar30;
                      if (uVar10 != pRVar17->c2n
                                    [(long)(int)lVar16 + (long)pRVar17->f2n[(long)pRVar30 * 4 + 3]])
                      {
                        uVar25 = 0xffffffff;
                        if (-1 < (int)uVar10) {
                          pRVar3 = ref_grid->cell[8]->ref_adj;
                          uVar25 = 0xffffffff;
                          if ((int)uVar10 < pRVar3->nnode) {
                            uVar25 = (ulong)(uint)pRVar3->first[uVar10];
                          }
                        }
                        local_600 = pRVar2;
                        if ((int)uVar25 != -1) {
                          iVar21 = ref_grid->cell[8]->ref_adj->item[(int)uVar25].ref;
                          do {
                            pRVar17 = ref_grid->cell[8];
                            if (0 < pRVar17->node_per) {
                              lVar16 = 0;
                              do {
                                pRVar7 = ref_grid->cell[10];
                                if ((pRVar7->c2n
                                     [pRVar7->size_per * lVar15 +
                                      (long)pRVar7->f2n[(ulong)pRVar2 | 2]] ==
                                     pRVar17->c2n[(long)iVar21 * (long)pRVar17->size_per + lVar16])
                                   && (uVar10 = ref_cavity_add_tet((REF_CAVITY)
                                                                   CONCAT44(local_4b8._4_4_,
                                                                            (uint)local_4b8),iVar21)
                                      , uVar10 != 0)) {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                         ,0x55e,"ref_layer_align_prism",(ulong)uVar10,"add tet");
                                  local_634 = uVar10;
                                  goto LAB_001fb14d;
                                }
                                pRVar17 = ref_grid->cell[8];
                                lVar16 = lVar16 + 1;
                              } while ((int)lVar16 < pRVar17->node_per);
                            }
                            pRVar4 = pRVar17->ref_adj->item;
                            iVar1 = pRVar4[(int)uVar25].next;
                            uVar25 = (ulong)iVar1;
                            if (uVar25 == 0xffffffffffffffff) {
                              iVar21 = -1;
                            }
                            else {
                              iVar21 = pRVar4[uVar25].ref;
                            }
                          } while (iVar1 != -1);
                        }
                        pRVar17 = ref_grid->cell[10];
                        iVar21 = pRVar17->c2n
                                 [pRVar17->size_per * lVar15 +
                                  (long)pRVar17->f2n[(long)((long)&local_600->n + 1)]];
                        uVar25 = 0xffffffff;
                        if (-1 < (long)iVar21) {
                          pRVar3 = ref_grid->cell[8]->ref_adj;
                          uVar25 = 0xffffffff;
                          if (iVar21 < pRVar3->nnode) {
                            uVar25 = (ulong)(uint)pRVar3->first[iVar21];
                          }
                        }
                        if ((int)uVar25 != -1) {
                          iVar21 = ref_grid->cell[8]->ref_adj->item[(int)uVar25].ref;
                          lVar16 = (long)local_5f8 * 4;
                          do {
                            pRVar17 = ref_grid->cell[8];
                            if (0 < pRVar17->node_per) {
                              lVar27 = 0;
                              do {
                                pRVar7 = ref_grid->cell[10];
                                if ((pRVar7->c2n
                                     [pRVar7->size_per * lVar15 + (long)pRVar7->f2n[lVar16 + 3]] ==
                                     pRVar17->c2n[(long)iVar21 * (long)pRVar17->size_per + lVar27])
                                   && (uVar10 = ref_cavity_add_tet((REF_CAVITY)
                                                                   CONCAT44(local_4b8._4_4_,
                                                                            (uint)local_4b8),iVar21)
                                      , uVar10 != 0)) {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                         ,0x565,"ref_layer_align_prism",(ulong)uVar10,"add tet");
                                  local_634 = uVar10;
                                  goto LAB_001fb14d;
                                }
                                pRVar17 = ref_grid->cell[8];
                                lVar27 = lVar27 + 1;
                              } while ((int)lVar27 < pRVar17->node_per);
                            }
                            pRVar4 = pRVar17->ref_adj->item;
                            iVar1 = pRVar4[(int)uVar25].next;
                            uVar25 = (ulong)iVar1;
                            if (uVar25 == 0xffffffffffffffff) {
                              iVar21 = -1;
                            }
                            else {
                              iVar21 = pRVar4[uVar25].ref;
                            }
                          } while (iVar1 != -1);
                        }
                      }
                      pRVar30 = local_5f8;
                      if ((**(uint **)(CONCAT44(local_4b8._4_4_,(uint)local_4b8) + 0x50) &
                          0xfffffffd) != 0) {
                        snprintf((char *)&local_438,0x400,"glue-%d-%d-cav.tec",iVar22,
                                 (ulong)local_5f8 & 0xffffffff);
                        printf("pyramid tets missing %d %s\n",
                               (ulong)**(uint **)(CONCAT44(local_4b8._4_4_,(uint)local_4b8) + 0x50),
                               &local_438);
                        if ((0 < ((REF_CAVITY)CONCAT44(local_4b8._4_4_,(uint)local_4b8))->nface) &&
                           (uVar10 = ref_cavity_tec((REF_CAVITY)
                                                    CONCAT44(local_4b8._4_4_,(uint)local_4b8),
                                                    (char *)&local_438), uVar10 != 0)) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                                 ,0x56e,"ref_layer_align_prism",(ulong)uVar10,"cav tec");
                          local_634 = uVar10;
                          break;
                        }
                      }
                      piVar8 = *(int **)(CONCAT44(local_4b8._4_4_,(uint)local_4b8) + 0x50);
                      if ((*piVar8 == 2) &&
                         (pRVar9 = *(REF_INT **)(piVar8 + 2),
                         uVar10 = ref_layer_tet_to_pyr(ref_grid,iVar22,*pRVar9,pRVar9[1]),
                         uVar10 != 0)) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                               ,0x576,"ref_layer_align_prism",(ulong)uVar10,"tet2pyr");
                        local_634 = uVar10;
                        break;
                      }
                      uVar10 = ref_cavity_free((REF_CAVITY)CONCAT44(local_4b8._4_4_,(uint)local_4b8)
                                              );
                      if (uVar10 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                               ,0x578,"ref_layer_align_prism",(ulong)uVar10,"cav free");
                        local_634 = uVar10;
                        break;
                      }
                      pRVar30 = (REF_DICT)((long)&pRVar30->n + 1);
                      lVar16 = (long)ref_grid->cell[10]->face_per;
                      bVar33 = (long)pRVar30 < lVar16;
                    } while ((long)pRVar30 < lVar16);
                  }
LAB_001fb14d:
                  pvVar14 = local_5f0;
                  if (bVar33) {
                    return local_634;
                  }
                }
                iVar22 = iVar22 + 1;
                pRVar17 = ref_grid->cell[10];
              } while (iVar22 < pRVar17->max);
            }
            local_634 = ref_export_by_extension(ref_grid,"ref_layer_prism_after.tec");
            if (local_634 == 0) {
              if (local_618 != (void *)0x0) {
                free(local_618);
              }
              local_634 = 0;
              if (pvVar14 != (void *)0x0) {
                free(pvVar14);
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                     ,0x57d,"ref_layer_align_prism",(ulong)local_634,"dump surf after");
            }
          }
        }
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",0x487
             ,"ref_layer_align_prism",(ulong)uVar13,"insert hair");
      local_634 = uVar13;
    }
  }
  return local_634;
LAB_001fa783:
  lVar15 = lVar15 + 1;
  if (pRVar7->node_per <= (int)lVar15) goto LAB_001fa790;
  goto LAB_001fa65e;
}

Assistant:

REF_FCN REF_STATUS ref_layer_align_prism(REF_GRID ref_grid,
                                         REF_DICT ref_dict_bcs) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT item, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_BOOL *active;
  REF_INT *off_node;

  RSS(ref_node_synchronize_globals(ref_node), "sync glob");

  RSS(ref_export_by_extension(ref_grid, "ref_layer_prism_before.tec"),
      "dump surf");

  ref_malloc_init(active, ref_node_max(ref_node), REF_BOOL, REF_FALSE);
  ref_malloc_init(off_node, ref_node_max(ref_node), REF_BOOL, REF_EMPTY);
  /* mark active nodes */
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    REF_INT bc = REF_EMPTY;
    RXS(ref_dict_value(ref_dict_bcs, nodes[ref_cell_id_index(ref_cell)], &bc),
        REF_NOT_FOUND, "bc");
    if (ref_phys_wall_distance_bc(bc)) {
      REF_INT cell_node;
      each_ref_cell_cell_node(ref_cell, cell_node) {
        active[nodes[cell_node]] = REF_TRUE;
      }
    }
  }

  RSS(ref_layer_prism_insert_hair(ref_grid, ref_dict_bcs, active, off_node),
      "insert hair");

  /* recover tet slides of prism tops, extend for boundary */
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (REF_EMPTY != off_node[nodes[0]] && REF_EMPTY != off_node[nodes[1]] &&
        REF_EMPTY != off_node[nodes[2]]) {
      REF_INT cell_edge;
      each_ref_cell_cell_edge(ref_cell, cell_edge) {
        REF_INT node0 = off_node[ref_cell_e2n(ref_cell, 0, cell_edge, cell)];
        REF_INT node1 = off_node[ref_cell_e2n(ref_cell, 1, cell_edge, cell)];
        REF_BOOL has_side;
        RSS(ref_cell_has_side(ref_grid_tet(ref_grid), node0, node1, &has_side),
            "find tet side");
        if (!has_side) {
          REF_CAVITY ref_cavity;
          REF_INT tet;
          RSS(ref_layer_seed_tet(ref_grid, node0, node1, &tet), "seed");
          RSS(ref_cavity_create(&ref_cavity), "cav create");
          RSS(ref_cavity_form_empty(ref_cavity, ref_grid, node1), "empty");
          RSS(ref_cavity_add_tet(ref_cavity, tet), "add tet");
          REIS(REF_CAVITY_UNKNOWN, ref_cavity_state(ref_cavity),
               "add tet not unknown");
          RSB(ref_cavity_enlarge_visible(ref_cavity), "enlarge", {
            ref_cavity_tec(ref_cavity, "cav-fail.tec");
            ref_export_by_extension(ref_grid, "mesh-fail.tec");
          });
          REIB(REF_CAVITY_VISIBLE, ref_cavity_state(ref_cavity),
               "prism top not visible", {
                 ref_cavity_tec(ref_cavity, "ref_layer_prism_cavity.tec");
                 ref_export_by_extension(ref_grid, "ref_layer_prism_mesh.tec");
               });
          RSB(ref_cavity_replace(ref_cavity), "cav replace", {
            ref_cavity_tec(ref_cavity, "ref_layer_prism_cavity.tec");
            ref_export_by_extension(ref_grid, "ref_layer_prism_mesh.tec");
          });
          RSS(ref_cavity_free(ref_cavity), "cav free");
        }
      }
    }
  }
  /* recover prism sides */
  {
    REF_INT cell_edge;
    REF_INT quad[4], face_nodes[4], tet0, tet1;
    REF_BOOL has_side;
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (REF_EMPTY != off_node[nodes[0]] && REF_EMPTY != off_node[nodes[1]] &&
          REF_EMPTY != off_node[nodes[2]]) {
        each_ref_cell_cell_edge(ref_cell, cell_edge) {
          quad[0] = REF_EMPTY;
          quad[1] = REF_EMPTY;
          quad[2] = REF_EMPTY;
          quad[3] = REF_EMPTY;
          RSS(ref_cell_has_side(
                  ref_grid_tet(ref_grid),
                  ref_cell_e2n(ref_cell, 0, cell_edge, cell),
                  off_node[ref_cell_e2n(ref_cell, 1, cell_edge, cell)],
                  &has_side),
              "diag");
          if (has_side) {
            quad[0] = ref_cell_e2n(ref_cell, 0, cell_edge, cell);
            quad[1] = ref_cell_e2n(ref_cell, 1, cell_edge, cell);
            quad[2] = off_node[ref_cell_e2n(ref_cell, 1, cell_edge, cell)];
            quad[3] = off_node[ref_cell_e2n(ref_cell, 0, cell_edge, cell)];
          }
          RSS(ref_cell_has_side(
                  ref_grid_tet(ref_grid),
                  ref_cell_e2n(ref_cell, 1, cell_edge, cell),
                  off_node[ref_cell_e2n(ref_cell, 0, cell_edge, cell)],
                  &has_side),
              "diag");
          if (has_side) {
            quad[0] = ref_cell_e2n(ref_cell, 1, cell_edge, cell);
            quad[1] = ref_cell_e2n(ref_cell, 0, cell_edge, cell);
            quad[2] = off_node[ref_cell_e2n(ref_cell, 0, cell_edge, cell)];
            quad[3] = off_node[ref_cell_e2n(ref_cell, 1, cell_edge, cell)];
          }
          RUS(REF_EMPTY, quad[0], "diag not found");
          face_nodes[0] = quad[0];
          face_nodes[1] = quad[1];
          face_nodes[2] = quad[2];
          face_nodes[3] = face_nodes[0];
          RSS(ref_cell_with_face(ref_grid_tet(ref_grid), face_nodes, &tet0,
                                 &tet1),
              "tets");
          if (tet0 == REF_EMPTY && tet1 == REF_EMPTY) {
            RSS(ref_layer_recover_face(ref_grid, face_nodes), "recover upper");
            printf("lower tets %d %d\n", tet0, tet1);
          }
          face_nodes[0] = quad[0];
          face_nodes[1] = quad[2];
          face_nodes[2] = quad[3];
          face_nodes[3] = face_nodes[0];
          RSS(ref_cell_with_face(ref_grid_tet(ref_grid), face_nodes, &tet0,
                                 &tet1),
              "tets");
          if (tet0 == REF_EMPTY && tet1 == REF_EMPTY) {
            RSS(ref_layer_recover_face(ref_grid, face_nodes), "recover upper");
            printf("upper tets %d %d\n", tet0, tet1);
          }
        }
      }
    }
  }
  /* remove quad slivers */
  {
    REF_INT cell_edge;
    REF_INT quad[4];
    REF_BOOL has_diag02, has_diag13;
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (REF_EMPTY != off_node[nodes[0]] && REF_EMPTY != off_node[nodes[1]] &&
          REF_EMPTY != off_node[nodes[2]]) {
        each_ref_cell_cell_edge(ref_cell, cell_edge) {
          quad[0] = ref_cell_e2n(ref_cell, 0, cell_edge, cell);
          quad[1] = ref_cell_e2n(ref_cell, 1, cell_edge, cell);
          quad[2] = off_node[ref_cell_e2n(ref_cell, 1, cell_edge, cell)];
          quad[3] = off_node[ref_cell_e2n(ref_cell, 0, cell_edge, cell)];
          RSS(ref_cell_has_side(ref_grid_tet(ref_grid), quad[0], quad[2],
                                &has_diag02),
              "diag02");
          RSS(ref_cell_has_side(ref_grid_tet(ref_grid), quad[1], quad[3],
                                &has_diag13),
              "diag13");
          if (has_diag02 && has_diag13) {
            printf("sliver\n");
            RSS(ref_layer_remove_sliver(ref_grid, quad), "remove sliver");
          }
        }
      }
    }
  }
  /* replace tets with prism */
  {
    REF_ADJ tri_tet;
    REF_INT deg;
    RSS(ref_adj_create(&tri_tet), "tet list");
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (REF_EMPTY != off_node[nodes[0]] && REF_EMPTY != off_node[nodes[1]] &&
          REF_EMPTY != off_node[nodes[2]]) {
        REF_CELL ref_tet = ref_grid_tet(ref_grid);
        REF_INT cell_node, tet, tet_nodes[REF_CELL_MAX_SIZE_PER],
            pri_nodes[REF_CELL_MAX_SIZE_PER];
        REF_BOOL contains;
        pri_nodes[0] = nodes[0];
        pri_nodes[1] = nodes[1];
        pri_nodes[2] = nodes[2];
        pri_nodes[3] = off_node[nodes[0]];
        pri_nodes[4] = off_node[nodes[1]];
        pri_nodes[5] = off_node[nodes[2]];
        each_ref_cell_having_node2(ref_tet, nodes[0], off_node[nodes[0]], item,
                                   cell_node, tet) {
          RSS(ref_cell_nodes(ref_tet, tet, tet_nodes), "tet");
          RSS(ref_layer_tet_prism(pri_nodes, tet_nodes, &contains), "contains");
          if (contains) {
            RSS(ref_adj_add_uniquely(tri_tet, cell, tet), "add");
          }
        }
        each_ref_cell_having_node2(ref_tet, nodes[1], off_node[nodes[1]], item,
                                   cell_node, tet) {
          RSS(ref_cell_nodes(ref_tet, tet, tet_nodes), "tet");
          RSS(ref_layer_tet_prism(pri_nodes, tet_nodes, &contains), "contains");
          if (contains) {
            RSS(ref_adj_add_uniquely(tri_tet, cell, tet), "add");
          }
        }
        each_ref_cell_having_node2(ref_tet, nodes[2], off_node[nodes[2]], item,
                                   cell_node, tet) {
          RSS(ref_cell_nodes(ref_tet, tet, tet_nodes), "tet");
          RSS(ref_layer_tet_prism(pri_nodes, tet_nodes, &contains), "contains");
          if (contains) {
            RSS(ref_adj_add_uniquely(tri_tet, cell, tet), "add");
          }
        }

        RSS(ref_adj_degree(tri_tet, cell, &deg), "deg");
        if (3 != deg) {
          REF_CAVITY ref_cavity;
          char filename[1024];
          RSS(ref_cavity_create(&ref_cavity), "cav create");
          RSS(ref_cavity_form_empty(ref_cavity, ref_grid, REF_EMPTY), "empty");
          each_ref_adj_node_item_with_ref(tri_tet, cell, item, tet) {
            RSS(ref_cavity_add_tet(ref_cavity, tet), "add tet");
          }
          snprintf(filename, 1024, "prism-%d-cav.tec", cell);
          printf("prism tets %d %s\n", deg, filename);
          RSS(ref_cavity_tec(ref_cavity, filename), "cav tec");
          RSS(ref_cavity_free(ref_cavity), "cav free");
        }
        if (3 == deg) {
          REF_INT new_pri;
          each_ref_adj_node_item_with_ref(tri_tet, cell, item, tet) {
            RSS(ref_cell_remove(ref_grid_tet(ref_grid), tet), "rm tet");
          }
          RSS(ref_cell_add(ref_grid_pri(ref_grid), pri_nodes, &new_pri),
              "add pri");
        }
      }
    }
    RSS(ref_adj_free(tri_tet), "free");
  }
  /* replace two tets with pyramid */
  each_ref_cell_valid_cell_with_nodes(ref_grid_pri(ref_grid), cell, nodes) {
    REF_CAVITY ref_cavity;
    char filename[1024];
    REF_INT cell_face, tet, cell_node;
    each_ref_cell_cell_face(ref_grid_pri(ref_grid), cell_face) {
      RSS(ref_cavity_create(&ref_cavity), "cav create");
      RSS(ref_cavity_form_empty(ref_cavity, ref_grid, REF_EMPTY), "empty");
      if (ref_cell_f2n(ref_grid_pri(ref_grid), 0, cell_face, cell) !=
          ref_cell_f2n(ref_grid_pri(ref_grid), 3, cell_face, cell)) {
        each_ref_cell_having_node2(
            ref_grid_tet(ref_grid),
            ref_cell_f2n(ref_grid_pri(ref_grid), 0, cell_face, cell),
            ref_cell_f2n(ref_grid_pri(ref_grid), 2, cell_face, cell), item,
            cell_node, tet) {
          RSS(ref_cavity_add_tet(ref_cavity, tet), "add tet");
        }
        each_ref_cell_having_node2(
            ref_grid_tet(ref_grid),
            ref_cell_f2n(ref_grid_pri(ref_grid), 1, cell_face, cell),
            ref_cell_f2n(ref_grid_pri(ref_grid), 3, cell_face, cell), item,
            cell_node, tet) {
          RSS(ref_cavity_add_tet(ref_cavity, tet), "add tet");
        }
      }
      if (2 != ref_list_n(ref_cavity_tet_list(ref_cavity)) &&
          0 != ref_list_n(ref_cavity_tet_list(ref_cavity))) {
        snprintf(filename, 1024, "glue-%d-%d-cav.tec", cell, cell_face);
        printf("pyramid tets missing %d %s\n",
               ref_list_n(ref_cavity_tet_list(ref_cavity)), filename);
        if (0 < ref_cavity_nface(ref_cavity))
          RSS(ref_cavity_tec(ref_cavity, filename), "cav tec");
      }
      if (2 == ref_list_n(ref_cavity_tet_list(ref_cavity))) {
        /* replace two tets with pyramid */
        RSS(ref_layer_tet_to_pyr(
                ref_grid, cell,
                ref_list_value(ref_cavity_tet_list(ref_cavity), 0),
                ref_list_value(ref_cavity_tet_list(ref_cavity), 1)),
            "tet2pyr");
      }
      RSS(ref_cavity_free(ref_cavity), "cav free");
    }
  }

  RSS(ref_export_by_extension(ref_grid, "ref_layer_prism_after.tec"),
      "dump surf after");
  ref_free(off_node);
  ref_free(active);

  return REF_SUCCESS;
}